

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int is_number(int c)

{
  undefined4 local_c;
  int c_local;
  
  if ((c < 0x30) || (0x39 < c)) {
    if (c == 0x2d) {
      local_c = 1;
    }
    else if (c == 0x2e) {
      local_c = 1;
    }
    else {
      local_c = 0;
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int is_number(int c)
{
  if (c >= '0' && c <= '9')
    return 1;
  if (c == '-')
    return 1;
  if (c == '.')
    return 1;
  return 0;
}